

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_lower_bounds.cpp
# Opt level: O0

ValuedAction __thiscall
despot::POMCPScenarioLowerBound::Value
          (POMCPScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  POMCPPrior *pPVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  const_reference ppSVar4;
  VNode *vnode;
  size_type sVar5;
  undefined4 extraout_var;
  double dVar6;
  ValuedAction VVar7;
  State *copy;
  State *particle;
  int i;
  VNode *root;
  History local_68;
  History *local_38;
  History *history_local;
  RandomStreams *streams_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles_local;
  POMCPScenarioLowerBound *this_local;
  ValuedAction va;
  
  pPVar1 = this->prior_;
  local_38 = history;
  history_local = (History *)streams;
  streams_local = (RandomStreams *)particles;
  particles_local = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)this;
  History::History(&local_68,history);
  (*pPVar1->_vptr_POMCPPrior[5])(pPVar1,&local_68);
  History::~History(&local_68);
  ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,0)
  ;
  vnode = POMCP::CreateVNode(0,*ppSVar4,this->prior_,(this->super_ScenarioLowerBound).model_);
  particle._4_4_ = 0;
  while( true ) {
    sVar5 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local);
    if (sVar5 <= (ulong)(long)particle._4_4_) break;
    ppSVar4 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local,
                         (long)particle._4_4_);
    pDVar2 = (this->super_ScenarioLowerBound).model_;
    iVar3 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,*ppSVar4);
    POMCP::Simulate((State *)CONCAT44(extraout_var,iVar3),(RandomStreams *)history_local,vnode,
                    (this->super_ScenarioLowerBound).model_,this->prior_);
    pDVar2 = (this->super_ScenarioLowerBound).model_;
    (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,(State *)CONCAT44(extraout_var,iVar3));
    particle._4_4_ = particle._4_4_ + 1;
  }
  VVar7 = POMCP::OptimalAction(vnode);
  va._0_8_ = VVar7.value;
  this_local._0_4_ = VVar7.action;
  dVar6 = State::Weight((vector<despot::State_*,_std::allocator<despot::State_*>_> *)streams_local);
  va._0_8_ = dVar6 * (double)va._0_8_;
  if (vnode != (VNode *)0x0) {
    VNode::~VNode(vnode);
    operator_delete(vnode,0x98);
  }
  VVar7._4_4_ = 0;
  VVar7.action = (uint)this_local;
  VVar7.value = (double)va._0_8_;
  return VVar7;
}

Assistant:

ValuedAction POMCPScenarioLowerBound::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	prior_->history(history);
	VNode* root = POMCP::CreateVNode(0, particles[0], prior_, model_);
	// Note that particles are assumed to be of equal weight
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		State* copy = model_->Copy(particle);
		POMCP::Simulate(copy, streams, root, model_, prior_);
		model_->Free(copy);
	}

	ValuedAction va = POMCP::OptimalAction(root);
	va.value *= State::Weight(particles);
	delete root;
	return va;
}